

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Tags::~Tags(Tags *this)

{
  Tag *pTVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = this->tags_count_;
  while (0 < iVar2) {
    this->tags_count_ = iVar2 - 1U;
    Tag::Clear(this->tags_ + (iVar2 - 1U));
    iVar2 = this->tags_count_;
  }
  pTVar1 = this->tags_;
  if (pTVar1 != (Tag *)0x0) {
    lVar3._0_4_ = pTVar1[-1].simple_tags_size_;
    lVar3._4_4_ = pTVar1[-1].simple_tags_count_;
    if (lVar3 != 0) {
      lVar3 = lVar3 << 4;
      do {
        Tag::~Tag((Tag *)((long)&pTVar1[-1].simple_tags_ + lVar3));
        lVar3 = lVar3 + -0x10;
      } while (lVar3 != 0);
    }
    operator_delete__(&pTVar1[-1].simple_tags_size_);
  }
  this->tags_ = (Tag *)0x0;
  return;
}

Assistant:

Tags::~Tags() {
  while (tags_count_ > 0) {
    Tag& tag = tags_[--tags_count_];
    tag.Clear();
  }

  delete[] tags_;
  tags_ = NULL;
}